

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::String_const&>(String *__return_storage_ptr__,kj *this,String *params)

{
  long lVar1;
  long local_18;
  ArrayPtr<const_char> *local_10;
  
  lVar1 = *(long *)(this + 8);
  local_18 = lVar1;
  if (lVar1 != 0) {
    local_18 = *(long *)this;
  }
  local_10 = (ArrayPtr<const_char> *)0x0;
  if (lVar1 != 0) {
    local_10 = (ArrayPtr<const_char> *)(lVar1 + -1);
  }
  _::concat<kj::ArrayPtr<char_const>>(__return_storage_ptr__,(_ *)&local_18,local_10);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}